

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_tpdf_free(lysf_ctx *ctx,lysp_tpdf *tpdf)

{
  lysp_ext_instance *plVar1;
  uint64_t c__;
  lysp_ext_instance *plVar2;
  long lVar3;
  
  lydict_remove(ctx->ctx,tpdf->name);
  lydict_remove(ctx->ctx,tpdf->units);
  lydict_remove(ctx->ctx,(tpdf->dflt).str);
  lydict_remove(ctx->ctx,tpdf->dsc);
  lydict_remove(ctx->ctx,tpdf->ref);
  lVar3 = 0;
  plVar2 = (lysp_ext_instance *)0x0;
  do {
    plVar1 = tpdf->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
LAB_00158c5b:
      lysp_type_free(ctx,&tpdf->type);
      return;
    }
    if (plVar1[-1].exts <= plVar2) {
      free(&plVar1[-1].exts);
      goto LAB_00158c5b;
    }
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar3));
    plVar2 = (lysp_ext_instance *)((long)&plVar2->name + 1);
    lVar3 = lVar3 + 0x70;
  } while( true );
}

Assistant:

static void
lysp_tpdf_free(struct lysf_ctx *ctx, struct lysp_tpdf *tpdf)
{
    lydict_remove(ctx->ctx, tpdf->name);
    lydict_remove(ctx->ctx, tpdf->units);
    lydict_remove(ctx->ctx, tpdf->dflt.str);
    lydict_remove(ctx->ctx, tpdf->dsc);
    lydict_remove(ctx->ctx, tpdf->ref);
    FREE_ARRAY(ctx, tpdf->exts, lysp_ext_instance_free);

    lysp_type_free(ctx, &tpdf->type);

}